

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

Builder * __thiscall
capnp::LocalCallContext::getResults
          (Builder *__return_storage_ptr__,LocalCallContext *this,
          Maybe<capnp::MessageSize> *sizeHint)

{
  Reader reader;
  bool bVar1;
  LocalResponse *pLVar2;
  Own<capnp::LocalResponse> *other;
  Own<capnp::ResponseHook> local_b0;
  Reader local_a0;
  Response<capnp::AnyPointer> local_80;
  Builder local_40;
  undefined1 local_28 [8];
  Own<capnp::LocalResponse> localResponse;
  Maybe<capnp::MessageSize> *sizeHint_local;
  LocalCallContext *this_local;
  
  localResponse.ptr = (LocalResponse *)sizeHint;
  bVar1 = kj::Maybe<capnp::Response<capnp::AnyPointer>_>::operator==(&this->response,(void *)0x0);
  if (bVar1) {
    kj::refcounted<capnp::LocalResponse,kj::Maybe<capnp::MessageSize>&>((kj *)local_28,sizeHint);
    pLVar2 = kj::Own<capnp::LocalResponse>::operator->((Own<capnp::LocalResponse> *)local_28);
    MessageBuilder::getRoot<capnp::AnyPointer>(&local_40,&(pLVar2->message).super_MessageBuilder);
    (this->responseBuilder).builder.pointer = local_40.builder.pointer;
    (this->responseBuilder).builder.segment = local_40.builder.segment;
    (this->responseBuilder).builder.capTable = local_40.builder.capTable;
    AnyPointer::Builder::asReader(&local_a0,&this->responseBuilder);
    other = kj::mv<kj::Own<capnp::LocalResponse>>((Own<capnp::LocalResponse> *)local_28);
    kj::Own<capnp::ResponseHook>::Own<capnp::LocalResponse,void>(&local_b0,other);
    reader.reader.capTable = local_a0.reader.capTable;
    reader.reader.segment = local_a0.reader.segment;
    reader.reader.pointer = local_a0.reader.pointer;
    reader.reader.nestingLimit = local_a0.reader.nestingLimit;
    reader.reader._28_4_ = local_a0.reader._28_4_;
    Response<capnp::AnyPointer>::Response(&local_80,reader,&local_b0);
    kj::Maybe<capnp::Response<capnp::AnyPointer>_>::operator=(&this->response,&local_80);
    Response<capnp::AnyPointer>::~Response(&local_80);
    kj::Own<capnp::ResponseHook>::~Own(&local_b0);
    kj::Own<capnp::LocalResponse>::~Own((Own<capnp::LocalResponse> *)local_28);
  }
  (__return_storage_ptr__->builder).segment = (this->responseBuilder).builder.segment;
  (__return_storage_ptr__->builder).capTable = (this->responseBuilder).builder.capTable;
  (__return_storage_ptr__->builder).pointer = (this->responseBuilder).builder.pointer;
  return __return_storage_ptr__;
}

Assistant:

AnyPointer::Builder getResults(kj::Maybe<MessageSize> sizeHint) override {
    if (response == nullptr) {
      auto localResponse = kj::refcounted<LocalResponse>(sizeHint);
      responseBuilder = localResponse->message.getRoot<AnyPointer>();
      response = Response<AnyPointer>(responseBuilder.asReader(), kj::mv(localResponse));
    }
    return responseBuilder;
  }